

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

CovergroupDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CovergroupDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::FunctionPortListSyntax*&,slang::syntax::SyntaxNode*&,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::MemberSyntax>const&,slang::parsing::Token&,slang::syntax::NamedBlockClauseSyntax*&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,Token *args_3,FunctionPortListSyntax **args_4,
          SyntaxNode **args_5,Token *args_6,SyntaxList<slang::syntax::MemberSyntax> *args_7,
          Token *args_8,NamedBlockClauseSyntax **args_9)

{
  Token extends;
  Token name;
  Token semi;
  Token endgroup;
  CovergroupDeclarationSyntax *pCVar1;
  NamedBlockClauseSyntax *in_RCX;
  undefined8 *in_RDX;
  Info *in_R8;
  undefined8 in_R9;
  long in_stack_00000010;
  Token *in_stack_00000020;
  undefined8 *in_stack_00000028;
  size_t in_stack_ffffffffffffff08;
  size_t in_stack_ffffffffffffff10;
  BumpAllocator *in_stack_ffffffffffffff18;
  undefined8 in_stack_ffffffffffffff48;
  
  pCVar1 = (CovergroupDeclarationSyntax *)
           allocate(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  extends.info = (Info *)pCVar1;
  extends.kind = (short)in_stack_ffffffffffffff48;
  extends._2_1_ = (char)((ulong)in_stack_ffffffffffffff48 >> 0x10);
  extends.numFlags.raw = (char)((ulong)in_stack_ffffffffffffff48 >> 0x18);
  extends.rawLen = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  name.info = (Info *)in_R8->rawTextPtr;
  name._0_8_ = *(undefined8 *)(in_stack_00000010 + 8);
  semi.info = (Info *)*in_RDX;
  semi._0_8_ = (in_RCX->super_SyntaxNode).parent;
  endgroup.info = in_R8;
  endgroup.kind = (short)in_R9;
  endgroup._2_1_ = (char)((ulong)in_R9 >> 0x10);
  endgroup.numFlags.raw = (char)((ulong)in_R9 >> 0x18);
  endgroup.rawLen = (int)((ulong)in_R9 >> 0x20);
  slang::syntax::CovergroupDeclarationSyntax::CovergroupDeclarationSyntax
            ((CovergroupDeclarationSyntax *)*in_stack_00000028,
             (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_00000020->info,
             *in_stack_00000020,extends,name,(FunctionPortListSyntax *)in_R8->location,
             *(SyntaxNode **)&in_RCX->super_SyntaxNode,semi,
             (SyntaxList<slang::syntax::MemberSyntax> *)in_RDX[1],endgroup,in_RCX);
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }